

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

xmlLinkPtr xmlListLinkReverseSearch(xmlListPtr l,void *data)

{
  int iVar1;
  xmlLinkPtr pxVar2;
  xmlLinkPtr pxVar3;
  
  pxVar2 = xmlListHigherSearch(l,data);
  if (pxVar2 == l->sentinel) {
    pxVar3 = (xmlLinkPtr)0x0;
  }
  else {
    iVar1 = (*l->linkCompare)(pxVar2->data,data);
    pxVar3 = (xmlLinkPtr)0x0;
    if (iVar1 == 0) {
      pxVar3 = pxVar2;
    }
  }
  return pxVar3;
}

Assistant:

static xmlLinkPtr
xmlListLinkReverseSearch(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;
    if (l == NULL)
        return(NULL);
    lk = xmlListHigherSearch(l, data);
    if (lk == l->sentinel)
        return NULL;
    else {
        if (l->linkCompare(lk->data, data) ==0)
            return lk;
        return NULL;
    }
}